

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O3

int EVP_PKEY_cmp(EVP_PKEY *a,EVP_PKEY *b)

{
  int iVar1;
  int iVar2;
  EVP_PKEY_ASN1_METHOD *pEVar3;
  
  iVar2 = -1;
  if (a->save_type == b->save_type) {
    pEVar3 = a->ameth;
    iVar2 = -2;
    if (pEVar3 != (EVP_PKEY_ASN1_METHOD *)0x0) {
      if (*(code **)(pEVar3 + 0x98) != (code *)0x0) {
        iVar1 = (**(code **)(pEVar3 + 0x98))(a,b);
        if (iVar1 < 1) {
          return iVar1;
        }
        pEVar3 = a->ameth;
      }
      if (*(code **)(pEVar3 + 0x28) != (code *)0x0) {
        iVar2 = (**(code **)(pEVar3 + 0x28))(a,b);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int EVP_PKEY_cmp(const EVP_PKEY *a, const EVP_PKEY *b) {
  if (a->type != b->type) {
    return -1;
  }

  if (a->ameth) {
    int ret;
    // Compare parameters if the algorithm has them
    if (a->ameth->param_cmp) {
      ret = a->ameth->param_cmp(a, b);
      if (ret <= 0) {
        return ret;
      }
    }

    if (a->ameth->pub_cmp) {
      return a->ameth->pub_cmp(a, b);
    }
  }

  return -2;
}